

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O1

wchar_t project_player_handler_FORCE(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  loc grid2;
  source origin;
  
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  grid2 = origin_get_loc(origin);
  if ((context->origin).what == SRC_TRAP) {
    _Var1 = loc_eq(player->grid,(loc_conflict)grid2);
    if (_Var1) {
      uVar2 = Rand_div(8);
      grid2 = (loc)loc_sum((loc_conflict)grid2,(loc_conflict)ddgrid_ddd[(int)uVar2]);
    }
  }
  p = player;
  uVar2 = Rand_div(0x14);
  player_inc_timed(p,L'\t',uVar2 + L'\x01',true,true,true);
  thrust_away((loc_conflict)grid2,(loc_conflict)context->grid,context->dam / 0x14 + L'\x03');
  return L'\0';
}

Assistant:

static int project_player_handler_FORCE(project_player_handler_context_t *context)
{
	struct loc centre = origin_get_loc(context->origin);

	/* Player gets pushed in a random direction if on the trap */
	if (context->origin.what == SRC_TRAP &&	loc_eq(player->grid, centre)) {
		int d = randint0(8);
		centre = loc_sum(centre, ddgrid_ddd[d]);
	}

	/* Stun */
	(void)player_inc_timed(player, TMD_STUN, randint1(20), true, true,
		true);

	/* Thrust player away. */
	thrust_away(centre, context->grid, 3 + context->dam / 20);
	return 0;
}